

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O3

String * __thiscall
sf::priv::ClipboardImpl::getStringImpl(String *__return_storage_ptr__,ClipboardImpl *this)

{
  byte bVar1;
  Int32 IVar2;
  long lVar3;
  Atom AVar4;
  Clock clock;
  Time local_38;
  Clock local_30;
  
  lVar3 = XGetSelectionOwner(this->m_display,this->m_clipboard);
  if (lVar3 == 0) {
    String::clear(&this->m_clipboardContents);
  }
  else {
    getInstance();
    processEventsImpl(&getInstance::instance);
    this->m_requestResponded = false;
    AVar4 = 0x1f;
    if (this->m_utf8String != 0) {
      AVar4 = this->m_utf8String;
    }
    XConvertSelection(this->m_display,this->m_clipboard,AVar4,this->m_targetProperty,this->m_window,
                      0);
    Clock::Clock(&local_30);
    bVar1 = this->m_requestResponded;
    if ((bool)bVar1 == false) {
      do {
        local_38 = Clock::getElapsedTime(&local_30);
        IVar2 = Time::asMilliseconds(&local_38);
        if (999 < IVar2) {
          bVar1 = this->m_requestResponded;
          goto LAB_00145ed5;
        }
        getInstance();
        processEventsImpl(&getInstance::instance);
      } while (this->m_requestResponded != true);
      bVar1 = 1;
    }
LAB_00145ed5:
    if ((bVar1 & 1) == 0) {
      String::clear(&this->m_clipboardContents);
    }
  }
  String::String(__return_storage_ptr__,&this->m_clipboardContents);
  return __return_storage_ptr__;
}

Assistant:

String ClipboardImpl::getStringImpl()
{
    // Check if anybody owns the current selection
    if (XGetSelectionOwner(m_display, m_clipboard) == None)
    {
        m_clipboardContents.clear();

        return m_clipboardContents;
    }

    // Process any already pending events
    processEvents();

    m_requestResponded = false;

    // Request the current selection to be converted to UTF-8 (or STRING
    // if UTF-8 is not available) and written to our window property
    XConvertSelection(
        m_display,
        m_clipboard,
        (m_utf8String != None) ? m_utf8String : XA_STRING,
        m_targetProperty,
        m_window,
        CurrentTime
    );

    Clock clock;

    // Wait for a response for up to 1000ms
    while (!m_requestResponded && (clock.getElapsedTime().asMilliseconds() < 1000))
        processEvents();

    // If no response was received within the time period, clear our clipboard contents
    if (!m_requestResponded)
        m_clipboardContents.clear();

    return m_clipboardContents;
}